

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O3

void deqp::gles3::Functional::evalTexture3DGrad(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Texture3D *pTVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  fVar1 = c->in[0].m_data[0];
  pTVar4 = c->textures[0].tex3D;
  fVar2 = c->in[0].m_data[1];
  fVar3 = c->in[0].m_data[2];
  fVar7 = glu::TextureTestUtil::computeLodFromDerivates
                    (LODMODE_EXACT,c->in[1].m_data[0] * (float)pTVar4->m_width,
                     c->in[1].m_data[1] * (float)pTVar4->m_height,
                     c->in[1].m_data[2] * (float)pTVar4->m_depth,
                     (float)pTVar4->m_width * c->in[2].m_data[0],
                     (float)pTVar4->m_height * c->in[2].m_data[1],
                     (float)pTVar4->m_depth * c->in[2].m_data[2]);
  pTVar4 = c->textures[0].tex3D;
  tcu::sampleLevelArray3D
            ((tcu *)&local_28,(pTVar4->m_view).m_levels,(pTVar4->m_view).m_numLevels,
             &c->textures[0].sampler,fVar1,fVar2,fVar3,fVar7);
  fVar1 = (p->scale).m_data[1];
  fVar2 = (p->scale).m_data[2];
  fVar3 = (p->scale).m_data[3];
  fVar7 = (p->bias).m_data[1];
  fVar5 = (p->bias).m_data[2];
  fVar6 = (p->bias).m_data[3];
  (c->color).m_data[0] = (p->scale).m_data[0] * local_28 + (p->bias).m_data[0];
  (c->color).m_data[1] = fVar1 * fStack_24 + fVar7;
  (c->color).m_data[2] = fVar2 * fStack_20 + fVar5;
  (c->color).m_data[3] = fVar3 * fStack_1c + fVar6;
  return;
}

Assistant:

static void		evalTexture3DGrad		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3D(c, c.in[0].x(), c.in[0].y(), c.in[0].z(), computeLodFromGrad3D(c))*p.scale + p.bias; }